

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O0

int32 dumb_resample_n_1_2(int n,DUMB_RESAMPLER *resampler,sample_t_conflict *dst,int32 dst_size,
                         DUMB_VOLUME_RAMP_INFO *volume_left,DUMB_VOLUME_RAMP_INFO *volume_right,
                         double delta)

{
  int in_EDI;
  double in_stack_00000140;
  DUMB_VOLUME_RAMP_INFO *in_stack_00000148;
  DUMB_VOLUME_RAMP_INFO *in_stack_00000150;
  undefined4 in_stack_00000158;
  int32 in_stack_0000015c;
  DUMB_VOLUME_RAMP_INFO *in_stack_00000160;
  undefined4 in_stack_00000168;
  int32 in_stack_0000016c;
  sample_t_conflict *in_stack_00000170;
  DUMB_RESAMPLER *in_stack_00000178;
  double in_stack_00000180;
  DUMB_VOLUME_RAMP_INFO *in_stack_00000188;
  DUMB_VOLUME_RAMP_INFO *in_stack_00000190;
  int32 in_stack_0000019c;
  sample_t_conflict *in_stack_000001a0;
  DUMB_RESAMPLER *in_stack_000001a8;
  undefined4 local_4;
  
  if (in_EDI == 8) {
    local_4 = dumb_resample_8_1_2((DUMB_RESAMPLER *)CONCAT44(in_stack_0000016c,in_stack_00000168),
                                  (sample_t_conflict *)in_stack_00000160,in_stack_0000015c,
                                  in_stack_00000150,in_stack_00000148,in_stack_00000140);
  }
  else if (in_EDI == 0x10) {
    local_4 = dumb_resample_16_1_2
                        (in_stack_00000178,in_stack_00000170,in_stack_0000016c,in_stack_00000160,
                         (DUMB_VOLUME_RAMP_INFO *)CONCAT44(in_stack_0000015c,in_stack_00000158),
                         (double)in_stack_00000150);
  }
  else {
    local_4 = dumb_resample_1_2(in_stack_000001a8,in_stack_000001a0,in_stack_0000019c,
                                in_stack_00000190,in_stack_00000188,in_stack_00000180);
  }
  return local_4;
}

Assistant:

int32 dumb_resample_n_1_2(int n, DUMB_RESAMPLER *resampler, sample_t *dst, int32 dst_size, DUMB_VOLUME_RAMP_INFO * volume_left, DUMB_VOLUME_RAMP_INFO * volume_right, double delta)
{
	if (n == 8)
		return dumb_resample_8_1_2(resampler, dst, dst_size, volume_left, volume_right, delta);
	else if (n == 16)
		return dumb_resample_16_1_2(resampler, dst, dst_size, volume_left, volume_right, delta);
	else
		return dumb_resample_1_2(resampler, dst, dst_size, volume_left, volume_right, delta);
}